

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O0

void __thiscall btLCP::pN_equals_ANC_times_qC(btLCP *this,btScalar *p,btScalar *q)

{
  int n;
  int iVar1;
  btScalar *in_RDX;
  long in_RSI;
  long in_RDI;
  btScalar bVar2;
  int i;
  int nN;
  btScalar *ptgt;
  int nC;
  undefined4 local_30;
  
  n = *(int *)(in_RDI + 0xc);
  iVar1 = *(int *)(in_RDI + 0x10);
  for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 1) {
    bVar2 = btLargeDot(*(btScalar **)(*(long *)(in_RDI + 0x18) + (long)(local_30 + n) * 8),in_RDX,n)
    ;
    *(btScalar *)(in_RSI + (long)n * 4 + (long)local_30 * 4) = bVar2;
  }
  return;
}

Assistant:

void btLCP::pN_equals_ANC_times_qC (btScalar *p, btScalar *q)
{
  // we could try to make this matrix-vector multiplication faster using
  // outer product matrix tricks, e.g. with the dMultidotX() functions.
  // but i tried it and it actually made things slower on random 100x100
  // problems because of the overhead involved. so we'll stick with the
  // simple method for now.
  const int nC = m_nC;
  btScalar *ptgt = p + nC;
  const int nN = m_nN;
  for (int i=0; i<nN; ++i) {
    ptgt[i] = btLargeDot (BTAROW(i+nC),q,nC);
  }
}